

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_putbit.c
# Opt level: O2

MPP_RET vp8e_put_bool(Vp8ePutBitBuf *bitbuf,RK_S32 prob,RK_S32 bool_value)

{
  RK_S32 *pRVar1;
  int iVar2;
  RK_U8 *pRVar3;
  int iVar4;
  
  iVar2 = ((bitbuf->range + -1) * prob >> 8) + 1;
  if (bool_value != 0) {
    bitbuf->bottom = bitbuf->bottom + iVar2;
    iVar2 = bitbuf->range - iVar2;
  }
  bitbuf->range = iVar2;
  while (iVar2 < 0x80) {
    iVar4 = bitbuf->bottom;
    if (iVar4 < 0) {
      pRVar3 = bitbuf->data;
      while( true ) {
        pRVar3 = pRVar3 + -1;
        if (*pRVar3 != 0xff) break;
        *pRVar3 = '\0';
      }
      *pRVar3 = *pRVar3 + '\x01';
      iVar2 = bitbuf->range;
      iVar4 = bitbuf->bottom;
    }
    iVar2 = iVar2 * 2;
    bitbuf->range = iVar2;
    bitbuf->bottom = iVar4 * 2;
    pRVar1 = &bitbuf->bits_left;
    *pRVar1 = *pRVar1 + -1;
    if (*pRVar1 == 0) {
      pRVar3 = bitbuf->data;
      bitbuf->data = pRVar3 + 1;
      *pRVar3 = (RK_U8)((uint)(iVar4 * 2) >> 0x18);
      bitbuf->byte_cnt = bitbuf->byte_cnt + 1;
      *(undefined1 *)((long)&bitbuf->bottom + 3) = 0;
      bitbuf->bits_left = 8;
      iVar2 = bitbuf->range;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_put_bool(Vp8ePutBitBuf *bitbuf, RK_S32 prob, RK_S32 bool_value)
{
    RK_S32 split = 1 + ((bitbuf->range - 1) * prob >> 8);

    if (bool_value) {
        bitbuf->bottom += split;
        bitbuf->range -= split;
    } else {
        bitbuf->range = split;
    }

    while (bitbuf->range < 128) {
        if (bitbuf->bottom < 0) {
            RK_U8 *data = bitbuf->data;
            while (*--data == 255) {
                *data = 0;
            }
            (*data)++;
        }
        bitbuf->range <<= 1;
        bitbuf->bottom <<= 1;

        if (!--bitbuf->bits_left) {
            *bitbuf->data++ = (bitbuf->bottom >> 24) & 0xff;
            bitbuf->byte_cnt++;
            bitbuf->bottom &= 0xffffff;     /* Keep 3 bytes */
            bitbuf->bits_left = 8;
        }
    }
    return MPP_OK;
}